

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix_storage_class.cpp
# Opt level: O0

Status __thiscall spvtools::opt::FixStorageClass::Process(FixStorageClass *this)

{
  Status SVar1;
  Module *this_00;
  anon_class_16_2_0e352904 local_48;
  function<void_(spvtools::opt::Instruction_*)> local_38;
  bool local_11;
  FixStorageClass *pFStack_10;
  bool modified;
  FixStorageClass *this_local;
  
  local_11 = false;
  pFStack_10 = this;
  this_00 = Pass::get_module(&this->super_Pass);
  local_48.modified = &local_11;
  local_48.this = this;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::FixStorageClass::Process()::__0,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_38,&local_48);
  Module::ForEachInst(this_00,&local_38,false);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_38);
  SVar1 = SuccessWithoutChange;
  if ((local_11 & 1U) != 0) {
    SVar1 = SuccessWithChange;
  }
  return SVar1;
}

Assistant:

Pass::Status FixStorageClass::Process() {
  bool modified = false;

  get_module()->ForEachInst([this, &modified](Instruction* inst) {
    if (inst->opcode() == spv::Op::OpVariable) {
      std::set<uint32_t> seen;
      std::vector<std::pair<Instruction*, uint32_t>> uses;
      get_def_use_mgr()->ForEachUse(inst,
                                    [&uses](Instruction* use, uint32_t op_idx) {
                                      uses.push_back({use, op_idx});
                                    });

      for (auto& use : uses) {
        modified |= PropagateStorageClass(
            use.first,
            static_cast<spv::StorageClass>(inst->GetSingleWordInOperand(0)),
            &seen);
        assert(seen.empty() && "Seen was not properly reset.");
        modified |=
            PropagateType(use.first, inst->type_id(), use.second, &seen);
        assert(seen.empty() && "Seen was not properly reset.");
      }
    }
  });
  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}